

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_sub(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  numeric *dat;
  string *str;
  any *in_RCX;
  proxy *in_RDI;
  any *in_stack_ffffffffffffff60;
  runtime_error *this_00;
  type_info *in_stack_ffffffffffffff68;
  proxy *this_01;
  undefined1 local_69 [41];
  numeric *in_stack_ffffffffffffffc0;
  numeric *in_stack_ffffffffffffffc8;
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff60);
  bVar1 = std::type_info::operator==((type_info *)this_01,in_stack_ffffffffffffff68);
  if (bVar1) {
    cs_impl::any::type(in_stack_ffffffffffffff60);
    bVar1 = std::type_info::operator==((type_info *)this_01,in_stack_ffffffffffffff68);
    if (bVar1) {
      dat = cs_impl::any::const_val<cs::numeric>(in_RCX);
      cs_impl::any::const_val<cs::numeric>(in_RCX);
      numeric::operator-(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      cs_impl::any::any<cs::numeric>((any *)this_01,dat);
      return (var)in_RDI;
    }
  }
  str = (string *)__cxa_allocate_exception(0x28);
  this_00 = (runtime_error *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_69 + 1),"Unsupported operator operations(Sub).",(allocator *)this_00);
  runtime_error::runtime_error(this_00,str);
  __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_sub(const var &a, const var &b)
	{
		if (a.type() == typeid(numeric) && b.type() == typeid(numeric))
			return a.const_val<numeric>() - b.const_val<numeric>();
		else
			throw runtime_error("Unsupported operator operations(Sub).");
	}